

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToBuffer::prepare
          (BufferCopyToBuffer *this,PrepareContext *context)

{
  Context *pCVar1;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  VkBuffer obj;
  VkDeviceMemory obj_00;
  Handle<(vk::HandleType)8> in_stack_ffffffffffffff58;
  Handle<(vk::HandleType)8> obj_01;
  VkDeviceMemory obj_02;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_a0;
  InstanceInterface *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined1 local_68 [20];
  uint uStack_54;
  VkAllocationCallbacks *pVStack_50;
  undefined8 local_48;
  deUint32 local_40;
  pointer local_38;
  
  pCVar1 = context->m_context;
  local_88 = pCVar1->m_vki;
  vk = pCVar1->m_vkd;
  physicalDevice = pCVar1->m_physicalDevice;
  device = pCVar1->m_device;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_80,&pCVar1->m_queueFamilies);
  pVStack_50 = (VkAllocationCallbacks *)context->m_currentBufferSize;
  this->m_bufferSize = (VkDeviceSize)pVStack_50;
  local_68._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_68._8_8_ = (void *)0x0;
  stack0xffffffffffffffa8 = (VkDevice)((ulong)uStack_54 << 0x20);
  local_48._0_4_ = 2;
  local_48._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  local_40 = (deUint32)
             ((ulong)((long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_38 = local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&stack0xffffffffffffff58,vk,device,
                     (VkBufferCreateInfo *)local_68,(VkAllocationCallbacks *)0x0);
  stack0xffffffffffffffa8 = DStack_a0.m_device;
  pVStack_50 = DStack_a0.m_allocator;
  local_68._8_8_ = DStack_a0.m_deviceIface;
  obj_01.m_internal = 0;
  DStack_a0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_a0.m_device = (VkDevice)0x0;
  DStack_a0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_68._0_8_ = in_stack_ffffffffffffff58.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj
              );
  }
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       stack0xffffffffffffffa8;
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVStack_50;
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_68._0_8_;
  (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_68._8_8_;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_a0,(VkBuffer)obj_01.m_internal);
  }
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&stack0xffffffffffffff58,local_88,vk,
                   physicalDevice,device,
                   (VkBuffer)
                   (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                   m_internal,(VkMemoryPropertyFlags)obj_01.m_internal);
  stack0xffffffffffffffa8 = DStack_a0.m_device;
  pVStack_50 = DStack_a0.m_allocator;
  local_68._8_8_ = DStack_a0.m_deviceIface;
  obj_02.m_internal = 0;
  DStack_a0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_a0.m_device = (VkDevice)0x0;
  DStack_a0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_68._0_8_ = obj_01.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,obj_00
              );
  }
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       stack0xffffffffffffffa8;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       pVStack_50;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       local_68._0_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_68._8_8_;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&DStack_a0,obj_02);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BufferCopyToBuffer::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_bufferSize = context.getBufferSize();

	m_dstBuffer	= createBuffer(vkd, device, m_bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies);
	m_memory	= bindBufferMemory(vki, vkd, physicalDevice, device, *m_dstBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT);
}